

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void set_fill_string(lyxp_set *set,char *string,uint16_t str_len)

{
  char *pcVar1;
  
  if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
    free((set->val).nodes);
  }
  set->type = LYXP_SET_STRING;
  if ((str_len == 0) && (*string != '\0')) {
    string = "";
  }
  pcVar1 = strndup(string,(ulong)str_len);
  (set->val).str = pcVar1;
  return;
}

Assistant:

static void
set_fill_string(struct lyxp_set *set, const char *string, uint16_t str_len)
{
    if (set->type == LYXP_SET_NODE_SET) {
        free(set->val.nodes);
    } else if (set->type == LYXP_SET_STRING) {
        free(set->val.str);
    }

    set->type = LYXP_SET_STRING;
    if ((str_len == 0) && (string[0] != '\0')) {
        string = "";
    }
    set->val.str = strndup(string, str_len);
}